

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

bool __thiscall flexbuffers::Verifier::VerifyKey(Verifier *this,uint8_t *p)

{
  uint8_t uVar1;
  pointer puVar2;
  bool bVar3;
  
  if (this->reuse_tracker_ != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    puVar2 = (this->reuse_tracker_->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (p[(long)puVar2 - (long)this->buf_] == '\x10') {
      return true;
    }
    if (p[(long)puVar2 - (long)this->buf_] != '\0') {
      return false;
    }
    p[(long)puVar2 - (long)this->buf_] = '\x10';
  }
  do {
    bVar3 = p < this->buf_ + this->size_;
    if (!bVar3) {
      return bVar3;
    }
    uVar1 = *p;
    p = p + 1;
  } while (uVar1 == '\0');
  return bVar3;
}

Assistant:

bool VerifyKey(const uint8_t *p) {
    FLEX_CHECK_VERIFIED(p, PackedType(BIT_WIDTH_8, FBT_KEY));
    while (p < buf_ + size_)
      if (*p++) return true;
    return false;
  }